

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O2

number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::nonbasicValue(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *__return_storage_ptr__,
               SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this)

{
  Status SVar1;
  long lVar2;
  pointer pnVar3;
  pointer pnVar4;
  StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar6;
  ulong uVar7;
  byte bVar8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  val;
  
  bVar8 = 0;
  StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::StableSum(&val);
  if (this->m_nonbasicValueUpToDate == true) {
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (&__return_storage_ptr__->m_backend,&(this->m_nonbasicValue).m_backend);
  }
  else {
    if (this->theRep == COLUMN) {
      uVar7 = (ulong)(uint)(this->
                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .
                           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .set.thenum;
      if (this->theType == LEAVE) {
        lVar2 = uVar7 << 7;
        for (; 0 < (int)uVar7; uVar7 = uVar7 - 1) {
          SVar1 = (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.colstat.data[uVar7 - 1];
          if (SVar1 == P_FIXED) {
            pnVar4 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .object.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
LAB_003dcdf1:
            pnVar3 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .low.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
LAB_003dcdfb:
            result.m_backend.fpclass = cpp_dec_float_finite;
            result.m_backend.prec_elem = 0x1c;
            result.m_backend.data._M_elems[0] = 0;
            result.m_backend.data._M_elems[1] = 0;
            result.m_backend.data._M_elems[2] = 0;
            result.m_backend.data._M_elems[3] = 0;
            result.m_backend.data._M_elems[4] = 0;
            result.m_backend.data._M_elems[5] = 0;
            result.m_backend.data._M_elems[6] = 0;
            result.m_backend.data._M_elems[7] = 0;
            result.m_backend.data._M_elems[8] = 0;
            result.m_backend.data._M_elems[9] = 0;
            result.m_backend.data._M_elems[10] = 0;
            result.m_backend.data._M_elems[0xb] = 0;
            result.m_backend.data._M_elems[0xc] = 0;
            result.m_backend.data._M_elems[0xd] = 0;
            result.m_backend.data._M_elems[0xe] = 0;
            result.m_backend.data._M_elems[0xf] = 0;
            result.m_backend.data._M_elems[0x10] = 0;
            result.m_backend.data._M_elems[0x11] = 0;
            result.m_backend.data._M_elems[0x12] = 0;
            result.m_backend.data._M_elems[0x13] = 0;
            result.m_backend.data._M_elems[0x14] = 0;
            result.m_backend.data._M_elems[0x15] = 0;
            result.m_backend.data._M_elems[0x16] = 0;
            result.m_backend.data._M_elems[0x17] = 0;
            result.m_backend.data._M_elems[0x18] = 0;
            result.m_backend.data._M_elems[0x19] = 0;
            result.m_backend.data._M_elems._104_5_ = 0;
            result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result.m_backend.exp = 0;
            result.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&result.m_backend,
                       (cpp_dec_float<200U,_int,_void> *)((long)&pnVar4[-1].m_backend.data + lVar2),
                       (cpp_dec_float<200U,_int,_void> *)((long)&pnVar3[-1].m_backend.data + lVar2))
            ;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      ((cpp_dec_float<200U,_int,_void> *)&val,&result.m_backend);
          }
          else {
            if (SVar1 == P_ON_LOWER) {
              pnVar4 = (this->theLCbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              goto LAB_003dcdf1;
            }
            if (SVar1 == P_ON_UPPER) {
              pnVar4 = (this->theUCbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pnVar3 = (this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .up.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              goto LAB_003dcdfb;
            }
          }
          lVar2 = lVar2 + -0x80;
        }
        uVar7 = (ulong)(uint)(this->
                             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).
                             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .
                             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .set.thenum;
        lVar2 = uVar7 << 7;
        for (; 0 < (int)uVar7; uVar7 = uVar7 - 1) {
          SVar1 = (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.rowstat.data[uVar7 - 1];
          if (SVar1 == P_FIXED) {
            pnVar4 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .object.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
LAB_003dd189:
            pnVar3 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .left.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
LAB_003dd190:
            result.m_backend.fpclass = cpp_dec_float_finite;
            result.m_backend.prec_elem = 0x1c;
            result.m_backend.data._M_elems[0] = 0;
            result.m_backend.data._M_elems[1] = 0;
            result.m_backend.data._M_elems[2] = 0;
            result.m_backend.data._M_elems[3] = 0;
            result.m_backend.data._M_elems[4] = 0;
            result.m_backend.data._M_elems[5] = 0;
            result.m_backend.data._M_elems[6] = 0;
            result.m_backend.data._M_elems[7] = 0;
            result.m_backend.data._M_elems[8] = 0;
            result.m_backend.data._M_elems[9] = 0;
            result.m_backend.data._M_elems[10] = 0;
            result.m_backend.data._M_elems[0xb] = 0;
            result.m_backend.data._M_elems[0xc] = 0;
            result.m_backend.data._M_elems[0xd] = 0;
            result.m_backend.data._M_elems[0xe] = 0;
            result.m_backend.data._M_elems[0xf] = 0;
            result.m_backend.data._M_elems[0x10] = 0;
            result.m_backend.data._M_elems[0x11] = 0;
            result.m_backend.data._M_elems[0x12] = 0;
            result.m_backend.data._M_elems[0x13] = 0;
            result.m_backend.data._M_elems[0x14] = 0;
            result.m_backend.data._M_elems[0x15] = 0;
            result.m_backend.data._M_elems[0x16] = 0;
            result.m_backend.data._M_elems[0x17] = 0;
            result.m_backend.data._M_elems[0x18] = 0;
            result.m_backend.data._M_elems[0x19] = 0;
            result.m_backend.data._M_elems._104_5_ = 0;
            result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result.m_backend.exp = 0;
            result.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&result.m_backend,
                       (cpp_dec_float<200U,_int,_void> *)((long)&pnVar4[-1].m_backend.data + lVar2),
                       (cpp_dec_float<200U,_int,_void> *)((long)&pnVar3[-1].m_backend.data + lVar2))
            ;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      ((cpp_dec_float<200U,_int,_void> *)&val,&result.m_backend);
          }
          else {
            if (SVar1 == P_ON_LOWER) {
              pnVar4 = (this->theURbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              goto LAB_003dd189;
            }
            if (SVar1 == P_ON_UPPER) {
              pnVar4 = (this->theLRbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pnVar3 = (this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .right.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              goto LAB_003dd190;
            }
          }
          lVar2 = lVar2 + -0x80;
        }
      }
      else {
        lVar2 = uVar7 << 7;
        for (; 0 < (int)uVar7; uVar7 = uVar7 - 1) {
          SVar1 = (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.colstat.data[uVar7 - 1];
          if ((SVar1 == P_FIXED) || (SVar1 == P_ON_LOWER)) {
            pnVar3 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .object.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pnVar4 = (this->theLCbound).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
LAB_003dd0d8:
            result.m_backend.fpclass = cpp_dec_float_finite;
            result.m_backend.prec_elem = 0x1c;
            result.m_backend.data._M_elems[0] = 0;
            result.m_backend.data._M_elems[1] = 0;
            result.m_backend.data._M_elems[2] = 0;
            result.m_backend.data._M_elems[3] = 0;
            result.m_backend.data._M_elems[4] = 0;
            result.m_backend.data._M_elems[5] = 0;
            result.m_backend.data._M_elems[6] = 0;
            result.m_backend.data._M_elems[7] = 0;
            result.m_backend.data._M_elems[8] = 0;
            result.m_backend.data._M_elems[9] = 0;
            result.m_backend.data._M_elems[10] = 0;
            result.m_backend.data._M_elems[0xb] = 0;
            result.m_backend.data._M_elems[0xc] = 0;
            result.m_backend.data._M_elems[0xd] = 0;
            result.m_backend.data._M_elems[0xe] = 0;
            result.m_backend.data._M_elems[0xf] = 0;
            result.m_backend.data._M_elems[0x10] = 0;
            result.m_backend.data._M_elems[0x11] = 0;
            result.m_backend.data._M_elems[0x12] = 0;
            result.m_backend.data._M_elems[0x13] = 0;
            result.m_backend.data._M_elems[0x14] = 0;
            result.m_backend.data._M_elems[0x15] = 0;
            result.m_backend.data._M_elems[0x16] = 0;
            result.m_backend.data._M_elems[0x17] = 0;
            result.m_backend.data._M_elems[0x18] = 0;
            result.m_backend.data._M_elems[0x19] = 0;
            result.m_backend.data._M_elems._104_5_ = 0;
            result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result.m_backend.exp = 0;
            result.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&result.m_backend,
                       (cpp_dec_float<200U,_int,_void> *)((long)&pnVar3[-1].m_backend.data + lVar2),
                       (cpp_dec_float<200U,_int,_void> *)((long)&pnVar4[-1].m_backend.data + lVar2))
            ;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      ((cpp_dec_float<200U,_int,_void> *)&val,&result.m_backend);
          }
          else if (SVar1 == P_ON_UPPER) {
            pnVar3 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .object.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pnVar4 = (this->theUCbound).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            goto LAB_003dd0d8;
          }
          lVar2 = lVar2 + -0x80;
        }
        uVar7 = (ulong)(uint)(this->
                             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).
                             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .
                             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .set.thenum;
        lVar2 = uVar7 << 7;
        for (; 0 < (int)uVar7; uVar7 = uVar7 - 1) {
          SVar1 = (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.rowstat.data[uVar7 - 1];
          if ((SVar1 == P_FIXED) || (SVar1 == P_ON_LOWER)) {
            pnVar3 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .object.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pnVar4 = (this->theURbound).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
LAB_003dd242:
            result.m_backend.fpclass = cpp_dec_float_finite;
            result.m_backend.prec_elem = 0x1c;
            result.m_backend.data._M_elems[0] = 0;
            result.m_backend.data._M_elems[1] = 0;
            result.m_backend.data._M_elems[2] = 0;
            result.m_backend.data._M_elems[3] = 0;
            result.m_backend.data._M_elems[4] = 0;
            result.m_backend.data._M_elems[5] = 0;
            result.m_backend.data._M_elems[6] = 0;
            result.m_backend.data._M_elems[7] = 0;
            result.m_backend.data._M_elems[8] = 0;
            result.m_backend.data._M_elems[9] = 0;
            result.m_backend.data._M_elems[10] = 0;
            result.m_backend.data._M_elems[0xb] = 0;
            result.m_backend.data._M_elems[0xc] = 0;
            result.m_backend.data._M_elems[0xd] = 0;
            result.m_backend.data._M_elems[0xe] = 0;
            result.m_backend.data._M_elems[0xf] = 0;
            result.m_backend.data._M_elems[0x10] = 0;
            result.m_backend.data._M_elems[0x11] = 0;
            result.m_backend.data._M_elems[0x12] = 0;
            result.m_backend.data._M_elems[0x13] = 0;
            result.m_backend.data._M_elems[0x14] = 0;
            result.m_backend.data._M_elems[0x15] = 0;
            result.m_backend.data._M_elems[0x16] = 0;
            result.m_backend.data._M_elems[0x17] = 0;
            result.m_backend.data._M_elems[0x18] = 0;
            result.m_backend.data._M_elems[0x19] = 0;
            result.m_backend.data._M_elems._104_5_ = 0;
            result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result.m_backend.exp = 0;
            result.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&result.m_backend,
                       (cpp_dec_float<200U,_int,_void> *)((long)&pnVar3[-1].m_backend.data + lVar2),
                       (cpp_dec_float<200U,_int,_void> *)((long)&pnVar4[-1].m_backend.data + lVar2))
            ;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      ((cpp_dec_float<200U,_int,_void> *)&val,&result.m_backend);
          }
          else if (SVar1 == P_ON_UPPER) {
            pnVar3 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .object.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pnVar4 = (this->theLRbound).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            goto LAB_003dd242;
          }
          lVar2 = lVar2 + -0x80;
        }
      }
    }
    else {
      uVar7 = (ulong)(uint)(this->
                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .
                           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .set.thenum;
      lVar2 = uVar7 << 7;
      for (; 0 < (int)uVar7; uVar7 = uVar7 - 1) {
        SVar1 = (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.colstat.data[uVar7 - 1];
        if (SVar1 == D_ON_BOTH) {
          result.m_backend.fpclass = cpp_dec_float_finite;
          result.m_backend.prec_elem = 0x1c;
          result.m_backend.data._M_elems[0] = 0;
          result.m_backend.data._M_elems[1] = 0;
          result.m_backend.data._M_elems[2] = 0;
          result.m_backend.data._M_elems[3] = 0;
          result.m_backend.data._M_elems[4] = 0;
          result.m_backend.data._M_elems[5] = 0;
          result.m_backend.data._M_elems[6] = 0;
          result.m_backend.data._M_elems[7] = 0;
          result.m_backend.data._M_elems[8] = 0;
          result.m_backend.data._M_elems[9] = 0;
          result.m_backend.data._M_elems[10] = 0;
          result.m_backend.data._M_elems[0xb] = 0;
          result.m_backend.data._M_elems[0xc] = 0;
          result.m_backend.data._M_elems[0xd] = 0;
          result.m_backend.data._M_elems[0xe] = 0;
          result.m_backend.data._M_elems[0xf] = 0;
          result.m_backend.data._M_elems[0x10] = 0;
          result.m_backend.data._M_elems[0x11] = 0;
          result.m_backend.data._M_elems[0x12] = 0;
          result.m_backend.data._M_elems[0x13] = 0;
          result.m_backend.data._M_elems[0x14] = 0;
          result.m_backend.data._M_elems[0x15] = 0;
          result.m_backend.data._M_elems[0x16] = 0;
          result.m_backend.data._M_elems[0x17] = 0;
          result.m_backend.data._M_elems[0x18] = 0;
          result.m_backend.data._M_elems[0x19] = 0;
          result.m_backend.data._M_elems._104_5_ = 0;
          result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result.m_backend.exp = 0;
          result.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result.m_backend,
                     (cpp_dec_float<200U,_int,_void> *)
                     ((long)&(this->theLCbound).val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar2),
                     (cpp_dec_float<200U,_int,_void> *)
                     ((long)&(this->
                             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).
                             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .up.val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar2));
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    ((cpp_dec_float<200U,_int,_void> *)&val,&result.m_backend);
LAB_003dcf05:
          pnVar3 = (this->theUCbound).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pnVar4 = (this->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .low.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
LAB_003dcf16:
          result.m_backend.fpclass = cpp_dec_float_finite;
          result.m_backend.prec_elem = 0x1c;
          result.m_backend.data._M_elems[0] = 0;
          result.m_backend.data._M_elems[1] = 0;
          result.m_backend.data._M_elems[2] = 0;
          result.m_backend.data._M_elems[3] = 0;
          result.m_backend.data._M_elems[4] = 0;
          result.m_backend.data._M_elems[5] = 0;
          result.m_backend.data._M_elems[6] = 0;
          result.m_backend.data._M_elems[7] = 0;
          result.m_backend.data._M_elems[8] = 0;
          result.m_backend.data._M_elems[9] = 0;
          result.m_backend.data._M_elems[10] = 0;
          result.m_backend.data._M_elems[0xb] = 0;
          result.m_backend.data._M_elems[0xc] = 0;
          result.m_backend.data._M_elems[0xd] = 0;
          result.m_backend.data._M_elems[0xe] = 0;
          result.m_backend.data._M_elems[0xf] = 0;
          result.m_backend.data._M_elems[0x10] = 0;
          result.m_backend.data._M_elems[0x11] = 0;
          result.m_backend.data._M_elems[0x12] = 0;
          result.m_backend.data._M_elems[0x13] = 0;
          result.m_backend.data._M_elems[0x14] = 0;
          result.m_backend.data._M_elems[0x15] = 0;
          result.m_backend.data._M_elems[0x16] = 0;
          result.m_backend.data._M_elems[0x17] = 0;
          result.m_backend.data._M_elems[0x18] = 0;
          result.m_backend.data._M_elems[0x19] = 0;
          result.m_backend.data._M_elems._104_5_ = 0;
          result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result.m_backend.exp = 0;
          result.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result.m_backend,
                     (cpp_dec_float<200U,_int,_void> *)((long)&pnVar3[-1].m_backend.data + lVar2),
                     (cpp_dec_float<200U,_int,_void> *)((long)&pnVar4[-1].m_backend.data + lVar2));
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    ((cpp_dec_float<200U,_int,_void> *)&val,&result.m_backend);
        }
        else {
          if (SVar1 == D_ON_LOWER) {
            pnVar3 = (this->theLCbound).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pnVar4 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .up.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            goto LAB_003dcf16;
          }
          if (SVar1 == D_ON_UPPER) goto LAB_003dcf05;
        }
        lVar2 = lVar2 + -0x80;
      }
      uVar7 = (ulong)(uint)(this->
                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .
                           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .set.thenum;
      lVar2 = uVar7 << 7;
      for (; 0 < (int)uVar7; uVar7 = uVar7 - 1) {
        SVar1 = (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.rowstat.data[uVar7 - 1];
        if (SVar1 == D_ON_BOTH) {
          result.m_backend.fpclass = cpp_dec_float_finite;
          result.m_backend.prec_elem = 0x1c;
          result.m_backend.data._M_elems[0] = 0;
          result.m_backend.data._M_elems[1] = 0;
          result.m_backend.data._M_elems[2] = 0;
          result.m_backend.data._M_elems[3] = 0;
          result.m_backend.data._M_elems[4] = 0;
          result.m_backend.data._M_elems[5] = 0;
          result.m_backend.data._M_elems[6] = 0;
          result.m_backend.data._M_elems[7] = 0;
          result.m_backend.data._M_elems[8] = 0;
          result.m_backend.data._M_elems[9] = 0;
          result.m_backend.data._M_elems[10] = 0;
          result.m_backend.data._M_elems[0xb] = 0;
          result.m_backend.data._M_elems[0xc] = 0;
          result.m_backend.data._M_elems[0xd] = 0;
          result.m_backend.data._M_elems[0xe] = 0;
          result.m_backend.data._M_elems[0xf] = 0;
          result.m_backend.data._M_elems[0x10] = 0;
          result.m_backend.data._M_elems[0x11] = 0;
          result.m_backend.data._M_elems[0x12] = 0;
          result.m_backend.data._M_elems[0x13] = 0;
          result.m_backend.data._M_elems[0x14] = 0;
          result.m_backend.data._M_elems[0x15] = 0;
          result.m_backend.data._M_elems[0x16] = 0;
          result.m_backend.data._M_elems[0x17] = 0;
          result.m_backend.data._M_elems[0x18] = 0;
          result.m_backend.data._M_elems[0x19] = 0;
          result.m_backend.data._M_elems._104_5_ = 0;
          result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result.m_backend.exp = 0;
          result.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result.m_backend,
                     (cpp_dec_float<200U,_int,_void> *)
                     ((long)&(this->theLRbound).val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar2),
                     (cpp_dec_float<200U,_int,_void> *)
                     ((long)&(this->
                             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).
                             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .right.val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar2));
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    ((cpp_dec_float<200U,_int,_void> *)&val,&result.m_backend);
LAB_003dd013:
          pnVar3 = (this->theURbound).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pnVar4 = (this->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .left.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
LAB_003dd021:
          result.m_backend.fpclass = cpp_dec_float_finite;
          result.m_backend.prec_elem = 0x1c;
          result.m_backend.data._M_elems[0] = 0;
          result.m_backend.data._M_elems[1] = 0;
          result.m_backend.data._M_elems[2] = 0;
          result.m_backend.data._M_elems[3] = 0;
          result.m_backend.data._M_elems[4] = 0;
          result.m_backend.data._M_elems[5] = 0;
          result.m_backend.data._M_elems[6] = 0;
          result.m_backend.data._M_elems[7] = 0;
          result.m_backend.data._M_elems[8] = 0;
          result.m_backend.data._M_elems[9] = 0;
          result.m_backend.data._M_elems[10] = 0;
          result.m_backend.data._M_elems[0xb] = 0;
          result.m_backend.data._M_elems[0xc] = 0;
          result.m_backend.data._M_elems[0xd] = 0;
          result.m_backend.data._M_elems[0xe] = 0;
          result.m_backend.data._M_elems[0xf] = 0;
          result.m_backend.data._M_elems[0x10] = 0;
          result.m_backend.data._M_elems[0x11] = 0;
          result.m_backend.data._M_elems[0x12] = 0;
          result.m_backend.data._M_elems[0x13] = 0;
          result.m_backend.data._M_elems[0x14] = 0;
          result.m_backend.data._M_elems[0x15] = 0;
          result.m_backend.data._M_elems[0x16] = 0;
          result.m_backend.data._M_elems[0x17] = 0;
          result.m_backend.data._M_elems[0x18] = 0;
          result.m_backend.data._M_elems[0x19] = 0;
          result.m_backend.data._M_elems._104_5_ = 0;
          result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result.m_backend.exp = 0;
          result.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result.m_backend,
                     (cpp_dec_float<200U,_int,_void> *)((long)&pnVar3[-1].m_backend.data + lVar2),
                     (cpp_dec_float<200U,_int,_void> *)((long)&pnVar4[-1].m_backend.data + lVar2));
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    ((cpp_dec_float<200U,_int,_void> *)&val,&result.m_backend);
        }
        else {
          if (SVar1 == D_ON_LOWER) {
            pnVar3 = (this->theLRbound).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pnVar4 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .right.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            goto LAB_003dd021;
          }
          if (SVar1 == D_ON_UPPER) goto LAB_003dd013;
        }
        lVar2 = lVar2 + -0x80;
      }
    }
    if (this->m_nonbasicValueUpToDate == false) {
      pSVar5 = &val;
      pnVar6 = &this->m_nonbasicValue;
      for (lVar2 = 0x1c; lVar2 != 0; lVar2 = lVar2 + -1) {
        (pnVar6->m_backend).data._M_elems[0] = (pSVar5->sum).m_backend.data._M_elems[0];
        pSVar5 = (StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)((long)pSVar5 + ((ulong)bVar8 * -2 + 1) * 4);
        pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)pnVar6 + (ulong)bVar8 * -8 + 4);
      }
      (this->m_nonbasicValue).m_backend.exp = val.sum.m_backend.exp;
      (this->m_nonbasicValue).m_backend.neg = val.sum.m_backend.neg;
      (this->m_nonbasicValue).m_backend.fpclass = val.sum.m_backend.fpclass;
      (this->m_nonbasicValue).m_backend.prec_elem = val.sum.m_backend.prec_elem;
      this->m_nonbasicValueUpToDate = true;
    }
    pSVar5 = &val;
    pnVar6 = __return_storage_ptr__;
    for (lVar2 = 0x1c; lVar2 != 0; lVar2 = lVar2 + -1) {
      (pnVar6->m_backend).data._M_elems[0] = (pSVar5->sum).m_backend.data._M_elems[0];
      pSVar5 = (StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)((long)pSVar5 + ((ulong)bVar8 * -2 + 1) * 4);
      pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar6 + ((ulong)bVar8 * -2 + 1) * 4);
    }
    (__return_storage_ptr__->m_backend).exp = val.sum.m_backend.exp;
    (__return_storage_ptr__->m_backend).neg = val.sum.m_backend.neg;
    (__return_storage_ptr__->m_backend).fpclass = val.sum.m_backend.fpclass;
    (__return_storage_ptr__->m_backend).prec_elem = val.sum.m_backend.prec_elem;
  }
  return __return_storage_ptr__;
}

Assistant:

R SPxSolverBase<R>::nonbasicValue()
   {
      int i;
      StableSum<R> val;
      const typename SPxBasisBase<R>::Desc& ds = this->desc();

#ifndef ENABLE_ADDITIONAL_CHECKS

      // if the value is available we don't need to recompute it
      if(m_nonbasicValueUpToDate)
         return m_nonbasicValue;

#endif

      if(rep() == COLUMN)
      {
         if(type() == LEAVE)
         {
            for(i = this->nCols() - 1; i >= 0; --i)
            {
               switch(ds.colStatus(i))
               {
               case SPxBasisBase<R>::Desc::P_ON_UPPER :
                  val += theUCbound[i] * SPxLPBase<R>::upper(i);
                  //@ val += maxObj(i) * SPxLPBase<R>::upper(i);
                  break;

               case SPxBasisBase<R>::Desc::P_ON_LOWER :
                  val += theLCbound[i] * SPxLPBase<R>::lower(i);
                  //@ val += maxObj(i) * SPxLPBase<R>::lower(i);
                  break;

               case SPxBasisBase<R>::Desc::P_FIXED :
                  assert(EQ(SPxLPBase<R>::lower(i), SPxLPBase<R>::upper(i), this->epsilon()));
                  val += this->maxObj(i) * SPxLPBase<R>::lower(i);
                  break;

               default:
                  break;
               }
            }

            for(i = this->nRows() - 1; i >= 0; --i)
            {
               switch(ds.rowStatus(i))
               {
               case SPxBasisBase<R>::Desc::P_ON_UPPER :
                  val += theLRbound[i] * SPxLPBase<R>::rhs(i);
                  break;

               case SPxBasisBase<R>::Desc::P_ON_LOWER :
                  val += theURbound[i] * SPxLPBase<R>::lhs(i);
                  break;

               case SPxBasisBase<R>::Desc::P_FIXED :
                  assert(EQ(SPxLPBase<R>::lhs(i), SPxLPBase<R>::rhs(i), this->epsilon()));
                  val += this->maxRowObj(i) * SPxLPBase<R>::lhs(i);
                  break;

               default:
                  break;
               }
            }
         }
         else
         {
            assert(type() == ENTER);

            for(i = this->nCols() - 1; i >= 0; --i)
            {
               switch(ds.colStatus(i))
               {
               case SPxBasisBase<R>::Desc::P_ON_UPPER :
                  val += this->maxObj(i) * theUCbound[i];
                  break;

               case SPxBasisBase<R>::Desc::P_ON_LOWER :
                  val += this->maxObj(i) * theLCbound[i];
                  break;

               case SPxBasisBase<R>::Desc::P_FIXED :
                  assert(EQ(theLCbound[i], theUCbound[i], this->epsilon()));
                  val += this->maxObj(i) * theLCbound[i];
                  break;

               default:
                  break;
               }
            }

            for(i = this->nRows() - 1; i >= 0; --i)
            {
               switch(ds.rowStatus(i))
               {
               case SPxBasisBase<R>::Desc::P_ON_UPPER :
                  val += this->maxRowObj(i) * theLRbound[i];
                  break;

               case SPxBasisBase<R>::Desc::P_ON_LOWER :
                  val += this->maxRowObj(i) * theURbound[i];
                  break;

               case SPxBasisBase<R>::Desc::P_FIXED :
                  assert(EQ(theLRbound[i], theURbound[i], this->epsilon()));
                  val += this->maxRowObj(i) * theURbound[i];
                  break;

               default:
                  break;
               }
            }
         }
      }
      else
      {
         assert(rep() == ROW);
         assert(type() == ENTER);

         for(i = this->nCols() - 1; i >= 0; --i)
         {
            switch(ds.colStatus(i))
            {
            case SPxBasisBase<R>::Desc::D_ON_UPPER :
               val += theUCbound[i] * this->lower(i);
               break;

            case SPxBasisBase<R>::Desc::D_ON_LOWER :
               val += theLCbound[i] * this->upper(i);
               break;

            case SPxBasisBase<R>::Desc::D_ON_BOTH :
               val += theLCbound[i] * this->upper(i);
               val += theUCbound[i] * this->lower(i);
               break;

            default:
               break;
            }
         }

         for(i = this->nRows() - 1; i >= 0; --i)
         {
            switch(ds.rowStatus(i))
            {
            case SPxBasisBase<R>::Desc::D_ON_UPPER :
               val += theURbound[i] * this->lhs(i);
               break;

            case SPxBasisBase<R>::Desc::D_ON_LOWER :
               val += theLRbound[i] * this->rhs(i);
               break;

            case SPxBasisBase<R>::Desc::D_ON_BOTH :
               val += theLRbound[i] * this->rhs(i);
               val += theURbound[i] * this->lhs(i);
               break;

            default:
               break;
            }
         }
      }

#ifdef ENABLE_ADDITIONAL_CHECKS

      if(m_nonbasicValueUpToDate && NE(m_nonbasicValue, val))
      {
         SPX_MSG_ERROR(std::cerr << "stored nonbasic value: " << m_nonbasicValue
                       << ", correct nonbasic value: " << val
                       << ", violation: " << val - m_nonbasicValue << std::endl;)
         assert(EQrel(m_nonbasicValue, val, 1e-12));
      }

#endif

      if(!m_nonbasicValueUpToDate)
      {
         m_nonbasicValue = R(val);
         m_nonbasicValueUpToDate = true;
      }

      return val;
   }